

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void yyerror(char *s,...)

{
  char in_AL;
  ushort **ppuVar1;
  __int32_t **pp_Var2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long lVar3;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  reportpreyyerror();
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 8;
  ap[0].fp_offset = 0x30;
  pre_yyerror_line = yylloc.first_line;
  error_state = error_state + 1;
  ap[0].reg_save_area = local_c8;
  vsnprintf(pre_yyerror_buf,0x7f,s,ap);
  ppuVar1 = __ctype_b_loc();
  lVar3 = (long)pre_yyerror_buf[0];
  if ((*(byte *)((long)*ppuVar1 + lVar3 * 2 + 1) & 2) != 0) {
    pp_Var2 = __ctype_toupper_loc();
    pre_yyerror_buf[0] = (char)(*pp_Var2)[lVar3];
  }
  return;
}

Assistant:

void yyerror(const char *s, ...) {
    reportpreyyerror();

    va_list ap, __attribute__((unused)) aq; /* aq may be unused */
    va_start(ap, s);
    pre_yyerror_line = yylloc.first_line;
    incerrorstate();

#ifndef NOYYERROR
    va_copy(aq, ap);
    typeerror(2, s, aq);
    va_end(aq);
#endif

    vsnprintf(pre_yyerror_buf, 127, s, ap);
    if (islower(pre_yyerror_buf[0]))
        pre_yyerror_buf[0] = (char)toupper(pre_yyerror_buf[0]);
    va_end(ap);
}